

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

void cimg_library::CImgDisplay::wait_all(void)

{
  int iVar1;
  timespec local_18;
  
  if (cimg::X11_attr()::val == '\0') {
    iVar1 = __cxa_guard_acquire(&cimg::X11_attr()::val);
    if (iVar1 != 0) {
      cimg::X11_info::X11_info(&cimg::X11_attr::val);
      __cxa_atexit(cimg::X11_info::~X11_info,&cimg::X11_attr::val,&__dso_handle);
      __cxa_guard_release(&cimg::X11_attr()::val);
    }
  }
  if (cimg::X11_attr::val.display != (Display *)0x0) {
    if (cimg::Mutex_attr()::val == '\0') {
      wait_all();
    }
    iVar1 = pthread_mutex_trylock((pthread_mutex_t *)(cimg::Mutex_attr()::val + 0x208));
    if (iVar1 == 0) {
      if (cimg::X11_attr()::val == '\0') {
        iVar1 = __cxa_guard_acquire(&cimg::X11_attr()::val);
        if (iVar1 != 0) {
          cimg::X11_info::X11_info(&cimg::X11_attr::val);
          __cxa_atexit(cimg::X11_info::~X11_info,&cimg::X11_attr::val,&__dso_handle);
          __cxa_guard_release(&cimg::X11_attr()::val);
        }
      }
      if (cimg::X11_attr()::val == '\0') {
        iVar1 = __cxa_guard_acquire(&cimg::X11_attr()::val);
        if (iVar1 != 0) {
          cimg::X11_info::X11_info(&cimg::X11_attr::val);
          __cxa_atexit(cimg::X11_info::~X11_info,&cimg::X11_attr::val,&__dso_handle);
          __cxa_guard_release(&cimg::X11_attr()::val);
        }
      }
      pthread_cond_wait((pthread_cond_t *)&cimg::X11_attr::val.wait_event,
                        (pthread_mutex_t *)&cimg::X11_attr::val.wait_event_mutex);
      if (cimg::Mutex_attr()::val == '\0') {
        wait_all();
      }
      pthread_mutex_unlock((pthread_mutex_t *)(cimg::Mutex_attr()::val + 0x208));
      return;
    }
    local_18.tv_sec = 0;
    local_18.tv_nsec = 10000000;
    nanosleep(&local_18,(timespec *)0x0);
  }
  return;
}

Assistant:

inline X11_info& X11_attr() { static X11_info val; return val; }